

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DefaultFBOMultisampleCase::randomizeViewport
          (DefaultFBOMultisampleCase *this)

{
  int iVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  RenderTarget *pRVar4;
  Functions *gl;
  DefaultFBOMultisampleCase *this_local;
  
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  pRVar4 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getWidth(pRVar4);
  iVar2 = de::Random::getInt(&this->m_rnd,0,iVar2 - this->m_viewportSize);
  this->m_viewportX = iVar2;
  pRVar4 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getHeight(pRVar4);
  iVar2 = de::Random::getInt(&this->m_rnd,0,iVar2 - this->m_viewportSize);
  this->m_viewportY = iVar2;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1a00))
            (this->m_viewportX,this->m_viewportY,this->m_viewportSize,this->m_viewportSize);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x180);
  return;
}

Assistant:

void DefaultFBOMultisampleCase::randomizeViewport (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_viewportX = m_rnd.getInt(0, m_context.getRenderTarget().getWidth()  - m_viewportSize);
	m_viewportY = m_rnd.getInt(0, m_context.getRenderTarget().getHeight() - m_viewportSize);

	gl.viewport(m_viewportX, m_viewportY, m_viewportSize, m_viewportSize);
	GLU_EXPECT_NO_ERROR(gl.getError(), "viewport");
}